

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.cpp
# Opt level: O0

BOOL VirtualFreeEnclosing_
               (LPVOID lpRegionStartAddress,SIZE_T dwSize,SIZE_T dwAlignmentSize,
               LPVOID lpActualAlignedStartAddress)

{
  int iVar1;
  size_t __len;
  size_t __len_00;
  CPalThread *pThread;
  PCMI pExistingEntry;
  bool bVar2;
  PCMI pMemoryToBeReleased;
  CPalThread *pthrCurrent;
  size_t beforeRegionSize2;
  SIZE_T alignmentDiff;
  bool afterRegionFreed;
  bool beforeRegionFreed;
  size_t afterRegionSize;
  char *afterRegionStart;
  size_t beforeRegionSize;
  char *beforeRegionStart;
  BOOL bRetVal;
  LPVOID lpActualAlignedStartAddress_local;
  SIZE_T dwAlignmentSize_local;
  SIZE_T dwSize_local;
  LPVOID lpRegionStartAddress_local;
  
  beforeRegionStart._4_4_ = 1;
  if (lpActualAlignedStartAddress < lpRegionStartAddress) {
    fprintf(_stderr,"] %s %s:%d","VirtualFreeEnclosing_",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/virtual.cpp"
            ,0x714);
    fprintf(_stderr,"Expression: lpActualAlignedStartAddress >= lpRegionStartAddress\n");
  }
  if ((LPVOID)((long)lpRegionStartAddress + dwAlignmentSize + dwSize) <= lpActualAlignedStartAddress
     ) {
    fprintf(_stderr,"] %s %s:%d","VirtualFreeEnclosing_",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/virtual.cpp"
            ,0x715);
    fprintf(_stderr,
            "Expression: lpActualAlignedStartAddress < (char*)lpRegionStartAddress + dwSize + dwAlignmentSize\n"
           );
  }
  __len = (long)lpActualAlignedStartAddress - (long)lpRegionStartAddress;
  __len_00 = dwAlignmentSize - __len;
  bVar2 = __len_00 == 0;
  if (dwSize + dwAlignmentSize != __len + dwSize + __len_00) {
    fprintf(_stderr,"] %s %s:%d","VirtualFreeEnclosing_",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/virtual.cpp"
            ,0x721);
    fprintf(_stderr,
            "Expression: dwSize + dwAlignmentSize == beforeRegionSize + dwSize + afterRegionSize\n")
    ;
  }
  if (__len != dwAlignmentSize - (ulong)lpRegionStartAddress % dwAlignmentSize) {
    fprintf(_stderr,"] %s %s:%d","VirtualFreeEnclosing_",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/virtual.cpp"
            ,0x725);
    fprintf(_stderr,"Expression: beforeRegionSize == beforeRegionSize2\n");
  }
  pThread = CorUnix::InternalGetCurrentThread();
  if (dwSize == 0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
      CorUnix::CPalThread::SetLastError(0x57);
      return 0;
    }
    abort();
  }
  CorUnix::InternalEnterCriticalSection(pThread,&virtual_critsec);
  pExistingEntry = VIRTUALFindRegionInformation((UINT_PTR)lpRegionStartAddress);
  if (pExistingEntry == (PCMI)0x0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    CorUnix::CPalThread::SetLastError(0x1e7);
    beforeRegionStart._4_4_ = 0;
  }
  else {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    iVar1 = munmap(lpRegionStartAddress,__len);
    if (iVar1 == 0) {
      if (!bVar2) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        iVar1 = munmap((void *)((long)lpActualAlignedStartAddress + dwSize),__len_00);
        if (iVar1 != 0) {
          fprintf(_stderr,"] %s %s:%d","VirtualFreeEnclosing_",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/virtual.cpp"
                  ,0x76b);
          fprintf(_stderr,"Unable to unmap the memory, munmap() returned an abnormal value.\n");
          CorUnix::CPalThread::SetLastError(0x54f);
          beforeRegionStart._4_4_ = 0;
          goto LAB_00240c5f;
        }
        bVar2 = true;
      }
      if (bVar2) {
        beforeRegionStart._4_4_ =
             VIRTUALUpdateAllocationInfo
                       (pExistingEntry,(UINT_PTR)lpActualAlignedStartAddress,dwSize);
      }
    }
    else {
      fprintf(_stderr,"] %s %s:%d","VirtualFreeEnclosing_",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/virtual.cpp"
              ,0x751);
      fprintf(_stderr,"Unable to unmap the memory, munmap() returned an abnormal value.\n");
      CorUnix::CPalThread::SetLastError(0x54f);
      beforeRegionStart._4_4_ = 0;
    }
  }
LAB_00240c5f:
  CorUnix::InternalLeaveCriticalSection(pThread,&virtual_critsec);
  return beforeRegionStart._4_4_;
}

Assistant:

BOOL
VirtualFreeEnclosing_(
    IN LPVOID lpRegionStartAddress,         /* Starting address of the original region. */
    IN SIZE_T dwSize,                       /* Size of the requested region i.e. the intended size of the VirtualAlloc call.*/
    IN SIZE_T dwAlignmentSize,              /* The intended alignment of the returned address. This is also the size of the extra memory reserved i.e. 64KB in our case whenw e try a 64K alignment. */
    IN LPVOID lpActualAlignedStartAddress)  /* Actual starting address that will be returned for the new allocation. */
{
    BOOL bRetVal = TRUE;

#ifdef DEBUG
    _ASSERTE(lpActualAlignedStartAddress >= lpRegionStartAddress);
    _ASSERTE(lpActualAlignedStartAddress < (char*)lpRegionStartAddress + dwSize + dwAlignmentSize);
#endif

    char * beforeRegionStart = (char *) lpRegionStartAddress;
    size_t beforeRegionSize = (char *) lpActualAlignedStartAddress - beforeRegionStart;
    char * afterRegionStart = (char *) lpActualAlignedStartAddress + dwSize;
    size_t afterRegionSize = dwAlignmentSize - beforeRegionSize;

    bool beforeRegionFreed = false;
    bool afterRegionFreed = (afterRegionSize == 0);

#ifdef DEBUG
    _ASSERTE(dwSize + dwAlignmentSize == beforeRegionSize + dwSize + afterRegionSize);

    SIZE_T alignmentDiff = ((ULONG_PTR)lpRegionStartAddress % dwAlignmentSize);
    size_t beforeRegionSize2 = dwAlignmentSize - alignmentDiff;
    _ASSERTE(beforeRegionSize == beforeRegionSize2);
#endif

    CPalThread *pthrCurrent;
    pthrCurrent = InternalGetCurrentThread();

    if (dwSize == 0)
    {
        ERROR("dwSize must be non-zero when releasing enclosing memory region.\n");
        pthrCurrent->SetLastError(ERROR_INVALID_PARAMETER);
        return FALSE;
    }

    InternalEnterCriticalSection(pthrCurrent, &virtual_critsec);

    PCMI pMemoryToBeReleased =
        VIRTUALFindRegionInformation((UINT_PTR)lpRegionStartAddress);

    if (!pMemoryToBeReleased)
    {
        ERROR("lpRegionStartAddress must be the base address returned by VirtualAlloc.\n");
        pthrCurrent->SetLastError(ERROR_INVALID_ADDRESS);
        bRetVal = FALSE;
        goto VirtualFreeEnclosingExit;
    }

    TRACE("Releasing the following memory %d to %d.\n", beforeRegionStart, beforeRegionSize);

#if (MMAP_IGNORES_HINT && !MMAP_DOESNOT_ALLOW_REMAP)
    if (mmap((void *)beforeRegionStart, beforeRegionSize, PROT_NONE, MAP_FIXED | MAP_PRIVATE, gBackingFile,
        (char *)beforeRegionStart - (char *)gBackingBaseAddress) != MAP_FAILED)
#else   // MMAP_IGNORES_HINT && !MMAP_DOESNOT_ALLOW_REMAP
    if (munmap((LPVOID)beforeRegionStart, beforeRegionSize) == 0)
#endif  // MMAP_IGNORES_HINT && !MMAP_DOESNOT_ALLOW_REMAP
    {
        beforeRegionFreed = true;
    }
    else
    {
#if MMAP_IGNORES_HINT
        ASSERT("Unable to remap the memory onto the backing file; "
            "error is %d.\n", errno);
#else   // MMAP_IGNORES_HINT
        ASSERT("Unable to unmap the memory, munmap() returned "
            "an abnormal value.\n");
#endif  // MMAP_IGNORES_HINT
        pthrCurrent->SetLastError(ERROR_INTERNAL_ERROR);
        bRetVal = FALSE;
        goto VirtualFreeEnclosingExit;
    }